

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::TanH_x86_avx2::forward_inplace(TanH_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [32];
  int iVar7;
  ulong uVar8;
  uint uVar9;
  float *pfVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [32];
  long lVar15;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar16 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 extraout_var [60];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar68 [16];
  undefined1 in_ZMM13 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  
  uVar11 = bottom_top_blob->c;
  uVar13 = (ulong)uVar11;
  uVar12 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar11) {
      uVar8 = 0;
      auVar35 = ZEXT3264(CONCAT428(0xc0000000,
                                   CONCAT424(0xc0000000,
                                             CONCAT420(0xc0000000,
                                                       CONCAT416(0xc0000000,
                                                                 CONCAT412(0xc0000000,
                                                                           CONCAT48(0xc0000000,
                                                                                                                                                                        
                                                  0xc0000000c0000000)))))));
      auVar67 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                   CONCAT424(0x42b0c0a5,
                                             CONCAT420(0x42b0c0a5,
                                                       CONCAT416(0x42b0c0a5,
                                                                 CONCAT412(0x42b0c0a5,
                                                                           CONCAT48(0x42b0c0a5,
                                                                                                                                                                        
                                                  0x42b0c0a542b0c0a5)))))));
      auVar50._8_4_ = 0xc2b0c0a5;
      auVar50._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar50._12_4_ = 0xc2b0c0a5;
      auVar50._16_4_ = 0xc2b0c0a5;
      auVar50._20_4_ = 0xc2b0c0a5;
      auVar50._24_4_ = 0xc2b0c0a5;
      auVar50._28_4_ = 0xc2b0c0a5;
      auVar77 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                   CONCAT424(0x3fb8aa3b,
                                             CONCAT420(0x3fb8aa3b,
                                                       CONCAT416(0x3fb8aa3b,
                                                                 CONCAT412(0x3fb8aa3b,
                                                                           CONCAT48(0x3fb8aa3b,
                                                                                                                                                                        
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar40 = ZEXT3264(CONCAT428(0x3f000000,
                                   CONCAT424(0x3f000000,
                                             CONCAT420(0x3f000000,
                                                       CONCAT416(0x3f000000,
                                                                 CONCAT412(0x3f000000,
                                                                           CONCAT48(0x3f000000,
                                                                                                                                                                        
                                                  0x3f0000003f000000)))))));
      auVar30._8_4_ = 0x3f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      auVar30._12_4_ = 0x3f800000;
      auVar30._16_4_ = 0x3f800000;
      auVar30._20_4_ = 0x3f800000;
      auVar30._24_4_ = 0x3f800000;
      auVar30._28_4_ = 0x3f800000;
      auVar37 = ZEXT3264(CONCAT428(0xbf317218,
                                   CONCAT424(0xbf317218,
                                             CONCAT420(0xbf317218,
                                                       CONCAT416(0xbf317218,
                                                                 CONCAT412(0xbf317218,
                                                                           CONCAT48(0xbf317218,
                                                                                                                                                                        
                                                  0xbf317218bf317218)))))));
      auVar20._8_4_ = 0x3f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._12_4_ = 0x3f800000;
      auVar20._16_4_ = 0x3f800000;
      auVar20._20_4_ = 0x3f800000;
      auVar20._24_4_ = 0x3f800000;
      auVar20._28_4_ = 0x3f800000;
      do {
        auVar54._8_4_ = 0x39506967;
        auVar54._0_8_ = 0x3950696739506967;
        auVar54._12_4_ = 0x39506967;
        auVar54._16_4_ = 0x39506967;
        auVar54._20_4_ = 0x39506967;
        auVar54._24_4_ = 0x39506967;
        auVar54._28_4_ = 0x39506967;
        auVar59._8_4_ = 0x3c088908;
        auVar59._0_8_ = 0x3c0889083c088908;
        auVar59._12_4_ = 0x3c088908;
        auVar59._16_4_ = 0x3c088908;
        auVar59._20_4_ = 0x3c088908;
        auVar59._24_4_ = 0x3c088908;
        auVar59._28_4_ = 0x3c088908;
        auVar63._8_4_ = 0x3d2aa9c1;
        auVar63._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar63._12_4_ = 0x3d2aa9c1;
        auVar63._16_4_ = 0x3d2aa9c1;
        auVar63._20_4_ = 0x3d2aa9c1;
        auVar63._24_4_ = 0x3d2aa9c1;
        auVar63._28_4_ = 0x3d2aa9c1;
        auVar28._8_4_ = 0x3e2aaaaa;
        auVar28._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar28._12_4_ = 0x3e2aaaaa;
        auVar28._16_4_ = 0x3e2aaaaa;
        auVar28._20_4_ = 0x3e2aaaaa;
        auVar28._24_4_ = 0x3e2aaaaa;
        auVar28._28_4_ = 0x3e2aaaaa;
        if (0 < (int)uVar12) {
          pauVar14 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar8 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar11 = uVar12;
          do {
            auVar71._0_4_ = auVar35._0_4_ * *(float *)*pauVar14;
            auVar71._4_4_ = auVar35._4_4_ * *(float *)((long)*pauVar14 + 4);
            auVar71._8_4_ = auVar35._8_4_ * *(float *)((long)*pauVar14 + 8);
            auVar71._12_4_ = auVar35._12_4_ * *(float *)((long)*pauVar14 + 0xc);
            auVar71._16_4_ = auVar35._16_4_ * *(float *)((long)*pauVar14 + 0x10);
            auVar71._20_4_ = auVar35._20_4_ * *(float *)((long)*pauVar14 + 0x14);
            auVar71._28_36_ = in_ZMM13._28_36_;
            auVar71._24_4_ = auVar35._24_4_ * *(float *)((long)*pauVar14 + 0x18);
            auVar48 = vminps_avx(auVar71._0_32_,auVar67._0_32_);
            auVar1 = vmaxps_avx(auVar48,auVar50);
            auVar39 = auVar40._0_32_;
            auVar24 = vfmadd213ps_fma(auVar77._0_32_,auVar1,auVar39);
            auVar19 = vroundps_avx(ZEXT1632(auVar24),1);
            auVar48 = vcmpps_avx(ZEXT1632(auVar24),auVar19,1);
            auVar48 = vandps_avx(auVar48,auVar30);
            auVar48 = vsubps_avx(auVar19,auVar48);
            auVar43 = vfmadd231ps_fma(auVar1,auVar48,auVar37._0_32_);
            auVar69 = ZEXT1632(auVar43);
            fVar2 = auVar43._0_4_;
            fVar3 = auVar43._4_4_;
            fVar4 = auVar43._8_4_;
            fVar5 = auVar43._12_4_;
            auVar1._28_4_ = auVar19._28_4_;
            auVar1._0_28_ =
                 ZEXT1628(CONCAT412(fVar5 * fVar5,
                                    CONCAT48(fVar4 * fVar4,CONCAT44(fVar3 * fVar3,fVar2 * fVar2))));
            auVar19 = auVar35._0_32_;
            auVar55._8_4_ = 0x3ab743ce;
            auVar55._0_8_ = 0x3ab743ce3ab743ce;
            auVar55._12_4_ = 0x3ab743ce;
            auVar55._16_4_ = 0x3ab743ce;
            auVar55._20_4_ = 0x3ab743ce;
            auVar55._24_4_ = 0x3ab743ce;
            auVar55._28_4_ = 0x3ab743ce;
            auVar24 = vfmadd213ps_fma(auVar54,auVar69,auVar55);
            auVar35 = ZEXT3264(auVar19);
            auVar40 = ZEXT3264(auVar39);
            auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar69,auVar59);
            auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar69,auVar63);
            auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),ZEXT1632(auVar43),auVar28);
            auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),ZEXT1632(auVar43),auVar39);
            auVar69._0_4_ = fVar2 + 1.0;
            auVar69._4_4_ = fVar3 + 1.0;
            auVar69._8_4_ = fVar4 + 1.0;
            auVar69._12_4_ = fVar5 + 1.0;
            auVar69._16_4_ = 0x3f800000;
            auVar69._20_4_ = 0x3f800000;
            auVar69._24_4_ = 0x3f800000;
            auVar69._28_4_ = 0x3f800000;
            auVar24 = vfmadd231ps_fma(auVar69,auVar1,ZEXT1632(auVar24));
            auVar39._0_4_ = (int)auVar48._0_4_;
            auVar39._4_4_ = (int)auVar48._4_4_;
            auVar39._8_4_ = (int)auVar48._8_4_;
            auVar39._12_4_ = (int)auVar48._12_4_;
            auVar39._16_4_ = (int)auVar48._16_4_;
            auVar39._20_4_ = (int)auVar48._20_4_;
            auVar39._24_4_ = (int)auVar48._24_4_;
            auVar39._28_4_ = (int)auVar48._28_4_;
            auVar77 = ZEXT3264(auVar77._0_32_);
            auVar48 = vpslld_avx2(auVar39,0x17);
            auVar48 = vpaddd_avx2(auVar48,auVar20);
            auVar24 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar24),auVar30);
            auVar48 = vrcpps_avx(ZEXT1632(auVar24));
            in_ZMM13 = ZEXT3264(auVar48);
            auVar24 = vfmsub213ps_fma(ZEXT1632(auVar24),auVar48,auVar30);
            auVar24 = vfnmadd132ps_fma(ZEXT1632(auVar24),auVar48,auVar48);
            auVar24 = vfnmsub213ps_fma(ZEXT1632(auVar24),auVar19,auVar30);
            *pauVar14 = ZEXT1632(auVar24);
            auVar67 = ZEXT3264(auVar67._0_32_);
            auVar37 = ZEXT3264(CONCAT428(0xbf317218,
                                         CONCAT424(0xbf317218,
                                                   CONCAT420(0xbf317218,
                                                             CONCAT416(0xbf317218,
                                                                       CONCAT412(0xbf317218,
                                                                                 CONCAT48(0xbf317218
                                                                                          ,
                                                  0xbf317218bf317218)))))));
            pauVar14 = pauVar14 + 1;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar13);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar11) {
      uVar8 = 0;
      auVar42._8_4_ = 0x42b0c0a5;
      auVar42._0_8_ = 0x42b0c0a542b0c0a5;
      auVar42._12_4_ = 0x42b0c0a5;
      auVar37 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
      auVar35 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
      auVar40 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar16._8_4_ = 0x3f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._12_4_ = 0x3f800000;
      auVar52._8_4_ = 0xbf317218;
      auVar52._0_8_ = 0xbf317218bf317218;
      auVar52._12_4_ = 0xbf317218;
      auVar67 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar61._8_4_ = 0x40000000;
      auVar61._0_8_ = 0x4000000040000000;
      auVar61._12_4_ = 0x40000000;
      do {
        auVar72._8_4_ = 0x3d2aa9c1;
        auVar72._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar72._12_4_ = 0x3d2aa9c1;
        auVar57._8_4_ = 0x3e2aaaaa;
        auVar57._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar57._12_4_ = 0x3e2aaaaa;
        if (0 < (int)uVar12) {
          pfVar10 = (float *)(bottom_top_blob->cstep * uVar8 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          uVar11 = uVar12;
          do {
            auVar78._0_4_ = *pfVar10 * -2.0;
            auVar78._4_4_ = pfVar10[1] * -2.0;
            auVar78._8_4_ = pfVar10[2] * -2.0;
            auVar78._12_4_ = pfVar10[3] * -2.0;
            auVar24 = vminps_avx(auVar78,auVar42);
            auVar47 = vmaxps_avx(auVar24,auVar37._0_16_);
            auVar38 = auVar40._0_16_;
            auVar24 = vfmadd213ps_fma(auVar35._0_16_,auVar47,auVar38);
            auVar22._0_4_ = (int)auVar24._0_4_;
            auVar22._4_4_ = (int)auVar24._4_4_;
            auVar22._8_4_ = (int)auVar24._8_4_;
            auVar22._12_4_ = (int)auVar24._12_4_;
            auVar43 = vcvtdq2ps_avx(auVar22);
            auVar24 = vcmpps_avx(auVar24,auVar43,1);
            auVar24 = vandps_avx(auVar24,auVar16);
            auVar24 = vsubps_avx(auVar43,auVar24);
            auVar47 = vfmadd231ps_fma(auVar47,auVar24,auVar52);
            fVar2 = auVar47._0_4_;
            auVar36._0_4_ = fVar2 * fVar2;
            fVar3 = auVar47._4_4_;
            auVar36._4_4_ = fVar3 * fVar3;
            fVar4 = auVar47._8_4_;
            auVar36._8_4_ = fVar4 * fVar4;
            fVar5 = auVar47._12_4_;
            auVar36._12_4_ = fVar5 * fVar5;
            auVar45._8_4_ = 0x39506967;
            auVar45._0_8_ = 0x3950696739506967;
            auVar45._12_4_ = 0x39506967;
            auVar53 = auVar67._0_16_;
            auVar73._8_4_ = 0x3ab743ce;
            auVar73._0_8_ = 0x3ab743ce3ab743ce;
            auVar73._12_4_ = 0x3ab743ce;
            auVar43 = vfmadd213ps_fma(auVar45,auVar47,auVar73);
            auVar74._8_4_ = 0x3c088908;
            auVar74._0_8_ = 0x3c0889083c088908;
            auVar74._12_4_ = 0x3c088908;
            auVar43 = vfmadd213ps_fma(auVar43,auVar47,auVar74);
            auVar40 = ZEXT1664(auVar38);
            auVar67 = ZEXT1664(auVar53);
            auVar43 = vfmadd213ps_fma(auVar43,auVar47,auVar72);
            auVar43 = vfmadd213ps_fma(auVar43,auVar47,auVar57);
            auVar43 = vfmadd213ps_fma(auVar43,auVar47,auVar38);
            auVar79._0_4_ = fVar2 + 1.0;
            auVar79._4_4_ = fVar3 + 1.0;
            auVar79._8_4_ = fVar4 + 1.0;
            auVar79._12_4_ = fVar5 + 1.0;
            auVar43 = vfmadd231ps_fma(auVar79,auVar36,auVar43);
            auVar23._0_4_ = (int)auVar24._0_4_;
            auVar23._4_4_ = (int)auVar24._4_4_;
            auVar23._8_4_ = (int)auVar24._8_4_;
            auVar23._12_4_ = (int)auVar24._12_4_;
            auVar24 = vpslld_avx(auVar23,0x17);
            auVar24 = vpaddd_avx(auVar24,auVar53);
            auVar43 = vfmadd213ps_fma(auVar24,auVar43,auVar16);
            auVar24 = vrcpps_avx(auVar43);
            auVar46._0_4_ = auVar24._0_4_ + auVar24._0_4_;
            auVar46._4_4_ = auVar24._4_4_ + auVar24._4_4_;
            auVar46._8_4_ = auVar24._8_4_ + auVar24._8_4_;
            auVar46._12_4_ = auVar24._12_4_ + auVar24._12_4_;
            auVar43 = vfmsub213ps_fma(auVar43,auVar46,auVar61);
            auVar24 = vfnmadd213ps_fma(auVar43,auVar24,auVar46);
            auVar37 = ZEXT1664(auVar37._0_16_);
            *pfVar10 = auVar24._0_4_ + -1.0;
            pfVar10[1] = auVar24._4_4_ + -1.0;
            pfVar10[2] = auVar24._8_4_ + -1.0;
            pfVar10[3] = auVar24._12_4_ + -1.0;
            auVar35 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
            pfVar10 = pfVar10 + 4;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar13);
    }
  }
  else if (0 < (int)uVar11) {
    uVar8 = 0;
    auVar48._8_4_ = 0x3f800000;
    auVar48._0_8_ = 0x3f8000003f800000;
    auVar48._12_4_ = 0x3f800000;
    auVar48._16_4_ = 0x3f800000;
    auVar48._20_4_ = 0x3f800000;
    auVar48._24_4_ = 0x3f800000;
    auVar48._28_4_ = 0x3f800000;
    auVar35 = ZEXT3264(auVar48);
    do {
      auVar81._8_4_ = 0x3e2aaaaa;
      auVar81._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar76._8_4_ = 0x3d2aa9c1;
      auVar76._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar70._8_4_ = 0x3c088908;
      auVar70._0_8_ = 0x3c0889083c088908;
      auVar66._8_4_ = 0x3ab743ce;
      auVar66._0_8_ = 0x3ab743ce3ab743ce;
      auVar64._8_4_ = 0x39506967;
      auVar64._0_8_ = 0x3950696739506967;
      auVar60._8_4_ = 0xbf317218;
      auVar60._0_8_ = 0xbf317218bf317218;
      auVar56._8_4_ = 0x3f800000;
      auVar56._0_8_ = 0x3f8000003f800000;
      auVar51._8_4_ = 0x3f000000;
      auVar51._0_8_ = 0x3f0000003f000000;
      auVar49._8_4_ = 0x3fb8aa3b;
      auVar49._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar44._8_4_ = 0xc2b0c0a5;
      auVar44._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar41._8_4_ = 0x42b0c0a5;
      auVar41._0_8_ = 0x42b0c0a542b0c0a5;
      auVar19._8_4_ = 0xc0000000;
      auVar19._0_8_ = 0xc0000000c0000000;
      auVar81._12_4_ = 0x3e2aaaaa;
      auVar76._12_4_ = 0x3d2aa9c1;
      auVar70._12_4_ = 0x3c088908;
      auVar66._12_4_ = 0x3ab743ce;
      auVar64._12_4_ = 0x39506967;
      auVar60._12_4_ = 0xbf317218;
      auVar56._12_4_ = 0x3f800000;
      auVar51._12_4_ = 0x3f000000;
      auVar49._12_4_ = 0x3fb8aa3b;
      auVar44._12_4_ = 0xc2b0c0a5;
      auVar41._12_4_ = 0x42b0c0a5;
      auVar19._12_4_ = 0xc0000000;
      auVar81._16_4_ = 0x3e2aaaaa;
      auVar76._16_4_ = 0x3d2aa9c1;
      auVar70._16_4_ = 0x3c088908;
      auVar66._16_4_ = 0x3ab743ce;
      auVar64._16_4_ = 0x39506967;
      auVar60._16_4_ = 0xbf317218;
      auVar56._16_4_ = 0x3f800000;
      auVar51._16_4_ = 0x3f000000;
      auVar49._16_4_ = 0x3fb8aa3b;
      auVar44._16_4_ = 0xc2b0c0a5;
      auVar41._16_4_ = 0x42b0c0a5;
      auVar19._16_4_ = 0xc0000000;
      auVar81._20_4_ = 0x3e2aaaaa;
      auVar76._20_4_ = 0x3d2aa9c1;
      auVar70._20_4_ = 0x3c088908;
      auVar66._20_4_ = 0x3ab743ce;
      auVar64._20_4_ = 0x39506967;
      auVar60._20_4_ = 0xbf317218;
      auVar56._20_4_ = 0x3f800000;
      auVar51._20_4_ = 0x3f000000;
      auVar49._20_4_ = 0x3fb8aa3b;
      auVar44._20_4_ = 0xc2b0c0a5;
      auVar41._20_4_ = 0x42b0c0a5;
      auVar19._20_4_ = 0xc0000000;
      auVar81._24_4_ = 0x3e2aaaaa;
      auVar76._24_4_ = 0x3d2aa9c1;
      auVar70._24_4_ = 0x3c088908;
      auVar66._24_4_ = 0x3ab743ce;
      auVar64._24_4_ = 0x39506967;
      auVar60._24_4_ = 0xbf317218;
      auVar56._24_4_ = 0x3f800000;
      auVar51._24_4_ = 0x3f000000;
      auVar49._24_4_ = 0x3fb8aa3b;
      auVar44._24_4_ = 0xc2b0c0a5;
      auVar41._24_4_ = 0x42b0c0a5;
      auVar19._24_4_ = 0xc0000000;
      auVar81._28_4_ = 0x3e2aaaaa;
      auVar76._28_4_ = 0x3d2aa9c1;
      auVar70._28_4_ = 0x3c088908;
      auVar66._28_4_ = 0x3ab743ce;
      auVar64._28_4_ = 0x39506967;
      auVar60._28_4_ = 0xbf317218;
      auVar56._28_4_ = 0x3f800000;
      auVar51._28_4_ = 0x3f000000;
      auVar49._28_4_ = 0x3fb8aa3b;
      auVar44._28_4_ = 0xc2b0c0a5;
      auVar41._28_4_ = 0x42b0c0a5;
      auVar19._28_4_ = 0xc0000000;
      pauVar14 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar8 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar12 < 8) {
        uVar11 = 0;
      }
      else {
        iVar7 = 7;
        do {
          auVar37._0_4_ = *(float *)*pauVar14 * -2.0;
          auVar37._4_4_ = *(float *)((long)*pauVar14 + 4) * -2.0;
          auVar37._8_4_ = *(float *)((long)*pauVar14 + 8) * -2.0;
          auVar37._12_4_ = *(float *)((long)*pauVar14 + 0xc) * -2.0;
          auVar37._16_4_ = *(float *)((long)*pauVar14 + 0x10) * -2.0;
          auVar37._20_4_ = *(float *)((long)*pauVar14 + 0x14) * -2.0;
          auVar37._28_36_ = auVar35._28_36_;
          auVar37._24_4_ = *(float *)((long)*pauVar14 + 0x18) * -2.0;
          auVar30 = vminps_avx(auVar37._0_32_,auVar41);
          auVar20 = vmaxps_avx(auVar30,auVar44);
          auVar24 = vfmadd213ps_fma(auVar49,auVar20,auVar51);
          auVar50 = vroundps_avx(ZEXT1632(auVar24),1);
          auVar30 = vcmpps_avx(ZEXT1632(auVar24),auVar50,1);
          auVar30 = vandps_avx(auVar56,auVar30);
          auVar30 = vsubps_avx(auVar50,auVar30);
          auVar43 = vfmadd231ps_fma(auVar20,auVar30,auVar60);
          auVar20 = ZEXT1632(auVar43);
          fVar2 = auVar43._0_4_;
          fVar3 = auVar43._4_4_;
          fVar4 = auVar43._8_4_;
          fVar5 = auVar43._12_4_;
          auVar6._28_4_ = auVar50._28_4_;
          auVar6._0_28_ =
               ZEXT1628(CONCAT412(fVar5 * fVar5,
                                  CONCAT48(fVar4 * fVar4,CONCAT44(fVar3 * fVar3,fVar2 * fVar2))));
          auVar24 = vfmadd213ps_fma(auVar64,auVar20,auVar66);
          auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar20,auVar70);
          auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar20,auVar76);
          auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),ZEXT1632(auVar43),auVar81);
          auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),ZEXT1632(auVar43),auVar51);
          auVar21._0_4_ = fVar2 + 1.0;
          auVar21._4_4_ = fVar3 + 1.0;
          auVar21._8_4_ = fVar4 + 1.0;
          auVar21._12_4_ = fVar5 + 1.0;
          auVar21._16_4_ = 0x3f800000;
          auVar21._20_4_ = 0x3f800000;
          auVar21._24_4_ = 0x3f800000;
          auVar21._28_4_ = 0x3f800000;
          auVar24 = vfmadd231ps_fma(auVar21,auVar6,ZEXT1632(auVar24));
          auVar29._0_4_ = (int)auVar30._0_4_;
          auVar29._4_4_ = (int)auVar30._4_4_;
          auVar29._8_4_ = (int)auVar30._8_4_;
          auVar29._12_4_ = (int)auVar30._12_4_;
          auVar29._16_4_ = (int)auVar30._16_4_;
          auVar29._20_4_ = (int)auVar30._20_4_;
          auVar29._24_4_ = (int)auVar30._24_4_;
          auVar29._28_4_ = (int)auVar30._28_4_;
          auVar30 = vpslld_avx2(auVar29,0x17);
          auVar30 = vpaddd_avx2(auVar30,auVar48);
          auVar24 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar24),auVar56);
          auVar30 = vrcpps_avx(ZEXT1632(auVar24));
          auVar35 = ZEXT3264(auVar30);
          auVar24 = vfmsub213ps_fma(ZEXT1632(auVar24),auVar30,auVar56);
          auVar24 = vfnmadd132ps_fma(ZEXT1632(auVar24),auVar30,auVar30);
          auVar24 = vfnmsub213ps_fma(ZEXT1632(auVar24),auVar19,auVar56);
          *pauVar14 = ZEXT1632(auVar24);
          pauVar14 = pauVar14 + 1;
          iVar7 = iVar7 + 8;
          uVar11 = uVar12 & 0xfffffff8;
        } while (iVar7 < (int)uVar12);
      }
      auVar43._8_4_ = 0xc2b0c0a5;
      auVar43._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar43._12_4_ = 0xc2b0c0a5;
      auVar47._8_4_ = 0x3fb8aa3b;
      auVar47._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar47._12_4_ = 0x3fb8aa3b;
      auVar38._8_4_ = 0x3f000000;
      auVar38._0_8_ = 0x3f0000003f000000;
      auVar38._12_4_ = 0x3f000000;
      auVar53._8_4_ = 0x3f800000;
      auVar53._0_8_ = 0x3f8000003f800000;
      auVar53._12_4_ = 0x3f800000;
      auVar58._8_4_ = 0xbf317218;
      auVar58._0_8_ = 0xbf317218bf317218;
      auVar58._12_4_ = 0xbf317218;
      auVar62._8_4_ = 0x39506967;
      auVar62._0_8_ = 0x3950696739506967;
      auVar62._12_4_ = 0x39506967;
      auVar65._8_4_ = 0x3ab743ce;
      auVar65._0_8_ = 0x3ab743ce3ab743ce;
      auVar65._12_4_ = 0x3ab743ce;
      auVar68._8_4_ = 0x3c088908;
      auVar68._0_8_ = 0x3c0889083c088908;
      auVar68._12_4_ = 0x3c088908;
      auVar75._8_4_ = 0x3d2aa9c1;
      auVar75._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar75._12_4_ = 0x3d2aa9c1;
      auVar80._8_4_ = 0x3e2aaaaa;
      auVar80._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar80._12_4_ = 0x3e2aaaaa;
      auVar24._8_4_ = 0x40000000;
      auVar24._0_8_ = 0x4000000040000000;
      auVar24._12_4_ = 0x40000000;
      uVar9 = uVar11 | 3;
      while ((int)uVar9 < (int)uVar12) {
        auVar27._0_4_ = *(float *)*pauVar14 * -2.0;
        auVar27._4_4_ = *(float *)((long)*pauVar14 + 4) * -2.0;
        auVar27._8_4_ = *(float *)((long)*pauVar14 + 8) * -2.0;
        auVar27._12_4_ = *(float *)((long)*pauVar14 + 0xc) * -2.0;
        auVar25._8_4_ = 0x42b0c0a5;
        auVar25._0_8_ = 0x42b0c0a542b0c0a5;
        auVar25._12_4_ = 0x42b0c0a5;
        auVar27 = vminps_avx(auVar27,auVar25);
        auVar17 = vmaxps_avx(auVar27,auVar43);
        auVar27 = vfmadd213ps_fma(auVar47,auVar17,auVar38);
        auVar31._0_4_ = (int)auVar27._0_4_;
        auVar31._4_4_ = (int)auVar27._4_4_;
        auVar31._8_4_ = (int)auVar27._8_4_;
        auVar31._12_4_ = (int)auVar27._12_4_;
        auVar18 = vcvtdq2ps_avx(auVar31);
        auVar27 = vcmpps_avx(auVar27,auVar18,1);
        auVar27 = vandps_avx(auVar53,auVar27);
        auVar27 = vsubps_avx(auVar18,auVar27);
        auVar17 = vfmadd231ps_fma(auVar17,auVar27,auVar58);
        fVar2 = auVar17._0_4_;
        auVar32._0_4_ = fVar2 * fVar2;
        fVar3 = auVar17._4_4_;
        auVar32._4_4_ = fVar3 * fVar3;
        fVar4 = auVar17._8_4_;
        auVar32._8_4_ = fVar4 * fVar4;
        fVar5 = auVar17._12_4_;
        auVar32._12_4_ = fVar5 * fVar5;
        auVar18 = vfmadd213ps_fma(auVar62,auVar17,auVar65);
        auVar18 = vfmadd213ps_fma(auVar18,auVar17,auVar68);
        auVar18 = vfmadd213ps_fma(auVar18,auVar17,auVar75);
        auVar18 = vfmadd213ps_fma(auVar18,auVar17,auVar80);
        auVar18 = vfmadd213ps_fma(auVar18,auVar17,auVar38);
        auVar17._0_4_ = fVar2 + 1.0;
        auVar17._4_4_ = fVar3 + 1.0;
        auVar17._8_4_ = fVar4 + 1.0;
        auVar17._12_4_ = fVar5 + 1.0;
        auVar18 = vfmadd231ps_fma(auVar17,auVar32,auVar18);
        auVar26._0_4_ = (int)auVar27._0_4_;
        auVar26._4_4_ = (int)auVar27._4_4_;
        auVar26._8_4_ = (int)auVar27._8_4_;
        auVar26._12_4_ = (int)auVar27._12_4_;
        auVar27 = vpslld_avx(auVar26,0x17);
        auVar33._8_4_ = 0x3f800000;
        auVar33._0_8_ = 0x3f8000003f800000;
        auVar33._12_4_ = 0x3f800000;
        auVar27 = vpaddd_avx(auVar27,auVar33);
        auVar18 = vfmadd213ps_fma(auVar27,auVar18,auVar53);
        auVar27 = vrcpps_avx(auVar18);
        auVar34._0_4_ = auVar27._0_4_ + auVar27._0_4_;
        auVar34._4_4_ = auVar27._4_4_ + auVar27._4_4_;
        auVar34._8_4_ = auVar27._8_4_ + auVar27._8_4_;
        auVar34._12_4_ = auVar27._12_4_ + auVar27._12_4_;
        auVar18 = vfmsub213ps_fma(auVar18,auVar34,auVar24);
        auVar27 = vfnmadd213ps_fma(auVar18,auVar27,auVar34);
        auVar18._0_4_ = auVar27._0_4_ + -1.0;
        auVar18._4_4_ = auVar27._4_4_ + -1.0;
        auVar18._8_4_ = auVar27._8_4_ + -1.0;
        auVar18._12_4_ = auVar27._12_4_ + -1.0;
        auVar35 = ZEXT1664(auVar18);
        *(undefined1 (*) [16])*pauVar14 = auVar18;
        pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
        uVar9 = uVar11 + 7;
        uVar11 = uVar11 + 4;
      }
      if (uVar12 - uVar11 != 0 && (int)uVar11 <= (int)uVar12) {
        lVar15 = 0;
        do {
          auVar35._0_4_ = tanhf(*(float *)((long)*pauVar14 + lVar15 * 4));
          auVar35._4_60_ = extraout_var;
          *(float *)((long)*pauVar14 + lVar15 * 4) = auVar35._0_4_;
          lVar15 = lVar15 + 1;
        } while (uVar12 - uVar11 != (int)lVar15);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar13);
  }
  return 0;
}

Assistant:

int TanH_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = tanh_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = tanh_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}